

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::schema::Node::SourceInfo::Reader> * __thiscall
capnp::compiler::Compiler::getSourceInfo
          (Maybe<capnp::schema::Node::SourceInfo::Reader> *__return_storage_ptr__,Compiler *this,
          uint64_t id)

{
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> LStack_28;
  
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)&LStack_28,
             &this->impl);
  Impl::getSourceInfo(__return_storage_ptr__,(LStack_28.ptr)->ptr,id);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked(&LStack_28);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<schema::Node::SourceInfo::Reader> Compiler::getSourceInfo(uint64_t id) const {
  return impl.lockExclusive()->get()->getSourceInfo(id);
}